

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::reduce_number_length(string *unit_string,char detect)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  string *local_a0;
  ulong local_88;
  size_type ploc_3;
  size_type ploc_2;
  bool valid_1;
  size_type dloc_1;
  size_type ploc_1;
  size_type ploc;
  bool valid;
  size_type dloc;
  size_type nloc;
  size_type zloc;
  size_t indexingloc;
  string *detseq;
  allocator local_12;
  char local_11;
  string *psStack_10;
  char detect_local;
  string *unit_string_local;
  
  local_11 = detect;
  psStack_10 = unit_string;
  if ((reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&reduce_number_length(std::__cxx11::string&,char)::
                                   zstring_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_,
               "00000",&local_12);
    std::allocator<char>::~allocator((allocator<char> *)&local_12);
    __cxa_atexit(std::__cxx11::string::~string,
                 &reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_);
  }
  if ((reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&reduce_number_length(std::__cxx11::string&,char)::
                                   nstring_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_,
               "99999",(allocator *)((long)&detseq + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&detseq + 3));
    __cxa_atexit(std::__cxx11::string::~string,
                 &reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_);
  }
  if (local_11 == '0') {
    local_a0 = &reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_;
  }
  else {
    local_a0 = &reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_;
  }
  nloc = std::__cxx11::string::find((string *)psStack_10,(ulong)local_a0);
  do {
    if (nloc == 0xffffffffffffffff) {
      return;
    }
    dloc = std::__cxx11::string::find_first_not_of((char)psStack_10,(ulong)(uint)(int)local_11);
    if (dloc == 0xffffffffffffffff) {
      if (local_11 != '9') {
        std::__cxx11::string::size();
        ploc_3 = std::__cxx11::string::find_last_of((char)psStack_10,0x2e);
        if (ploc_3 != 0xffffffffffffffff) {
          bVar1 = true;
          if (ploc_3 == nloc - 1) {
            nloc = nloc - 1;
            bVar1 = false;
            do {
              do {
              } while (ploc_3 == 0);
              ploc_3 = ploc_3 - 1;
              pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_10);
              bVar2 = isDigitCharacter(*pcVar4);
              if (!bVar2) goto LAB_0019e74f;
              pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_10);
            } while (*pcVar4 == '0');
            bVar1 = true;
          }
          else {
            do {
              local_88 = ploc_3 + 1;
              if (nloc <= local_88) goto LAB_0019e74f;
              pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_10);
              bVar2 = isDigitCharacter(*pcVar4);
              ploc_3 = local_88;
            } while (bVar2);
            bVar1 = false;
          }
LAB_0019e74f:
          if (bVar1) {
            shorten_number(psStack_10,nloc,-nloc - 1);
          }
        }
      }
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_10);
      if (*pcVar4 != '.') {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_10);
        bVar1 = isDigitCharacter(*pcVar4);
        if (bVar1) {
          uVar5 = std::__cxx11::string::size();
          if (dloc + 1 < uVar5) {
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_10);
            bVar1 = isDigitCharacter(*pcVar4);
            if (!bVar1) goto LAB_0019e4b8;
          }
        }
        else {
LAB_0019e4b8:
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_10);
          bVar1 = isDigitCharacter(*pcVar4);
          if (bVar1) {
            dloc = dloc + 1;
          }
          ploc_1 = std::__cxx11::string::find_last_of((char)psStack_10,0x2e);
          if ((ploc_1 != 0xffffffffffffffff) && (0xc < dloc - ploc_1)) {
            bVar1 = true;
            if (ploc_1 == nloc - 1) {
              nloc = nloc - 1;
              bVar1 = false;
              do {
                if (ploc_1 == 0) goto LAB_0019e621;
                ploc_1 = ploc_1 - 1;
                pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_10);
                bVar2 = isDigitCharacter(*pcVar4);
                if (!bVar2) goto LAB_0019e621;
                pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_10);
              } while (*pcVar4 == '0');
              bVar1 = true;
            }
            else {
              do {
                dloc_1 = ploc_1 + 1;
                if (nloc <= dloc_1) goto LAB_0019e621;
                pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_10);
                bVar2 = isDigitCharacter(*pcVar4);
                ploc_1 = dloc_1;
              } while (bVar2);
              bVar1 = false;
            }
LAB_0019e621:
            if (bVar1) {
              shorten_number(psStack_10,nloc,dloc - nloc);
            }
          }
        }
      }
    }
    nloc = std::__cxx11::string::find((string *)psStack_10,(ulong)local_a0);
  } while( true );
}

Assistant:

static void reduce_number_length(std::string& unit_string, char detect)
{
    static const std::string zstring("00000");
    static const std::string nstring("99999");
    const std::string& detseq(detect == '0' ? zstring : nstring);
    // search for a bunch of zeros in a row
    std::size_t indexingloc{0};

    auto zloc = unit_string.find(detseq);
    while (zloc != std::string::npos) {
        auto nloc = unit_string.find_first_not_of(detect, zloc + 5);
        indexingloc = zloc + 5;
        if (nloc != std::string::npos) {
            indexingloc = nloc + 1;
            if (unit_string[nloc] != '.') {
                if (!isDigitCharacter(unit_string[nloc]) ||
                    (unit_string.size() > nloc + 1 &&
                     !isDigitCharacter(unit_string[nloc + 1]))) {
                    if (isDigitCharacter(unit_string[nloc])) {
                        ++nloc;
                    }

                    auto dloc = unit_string.find_last_of('.', zloc);

                    if (dloc != std::string::npos && nloc - dloc > 12) {
                        bool valid = true;
                        if (dloc == zloc - 1) {
                            --zloc;
                            auto ploc = dloc;
                            valid = false;
                            while (true) {
                                if (ploc <= 0) {
                                    break;
                                }
                                --ploc;
                                if (!isDigitCharacter(unit_string[ploc])) {
                                    break;
                                }
                                if (unit_string[ploc] != '0') {
                                    valid = true;
                                    break;
                                }
                            }
                        } else {
                            auto ploc = dloc + 1;
                            while (ploc < zloc) {
                                if (!isDigitCharacter(unit_string[ploc])) {
                                    valid = false;
                                    break;
                                }
                                ++ploc;
                            }
                        }
                        if (valid) {
                            shorten_number(unit_string, zloc, nloc - zloc);
                            indexingloc = zloc + 1;
                        }
                    }
                }
            }
        } else if (detect != '9') {
            indexingloc = unit_string.size();
            auto dloc = unit_string.find_last_of('.', zloc);

            if (dloc != std::string::npos) {
                bool valid = true;
                if (dloc == zloc - 1) {
                    --zloc;
                    auto ploc = dloc;
                    valid = false;
                    while (true) {
                        if (ploc > 0) {
                            --ploc;
                            if (!isDigitCharacter(unit_string[ploc])) {
                                break;
                            }
                            if (unit_string[ploc] != '0') {
                                valid = true;
                                break;
                            }
                        }
                    }
                } else {
                    auto ploc = dloc + 1;
                    while (ploc < zloc) {
                        if (!isDigitCharacter(unit_string[ploc])) {
                            valid = false;
                            break;
                        }
                        ++ploc;
                    }
                }
                if (valid) {
                    shorten_number(unit_string, zloc, nloc - zloc);
                    indexingloc = zloc + 1;
                }
            }
        }
        zloc = unit_string.find(detseq, indexingloc);
    }
}